

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O0

bool __thiscall
Saturation::PredicateSplitPassiveClauseContainer::setLimitsFromSimulation
          (PredicateSplitPassiveClauseContainer *this)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  long in_RDI;
  bool currTightened;
  unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  *queue;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  *__range1;
  bool tightened;
  undefined6 in_stack_ffffffffffffffc8;
  byte in_stack_ffffffffffffffce;
  byte in_stack_ffffffffffffffcf;
  __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
  local_20;
  long local_18;
  byte local_9;
  
  local_9 = 0;
  local_18 = in_RDI + 0x80;
  local_20._M_current =
       (unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
        *)std::
          vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
          ::begin((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffcf,
                              CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)));
  std::
  vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ::end((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
         *)CONCAT17(in_stack_ffffffffffffffcf,
                    CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffcf,
                                   CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)));
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
          *)__gnu_cxx::
            __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
            ::operator*(&local_20);
    pPVar3 = std::
             unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
             ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                           *)0xaca28a);
    iVar2 = (*(pPVar3->super_RandomAccessClauseContainer).super_ClauseContainer.
              _vptr_ClauseContainer[0xb])();
    in_stack_ffffffffffffffcf = (byte)iVar2 & 1;
    in_stack_ffffffffffffffce = 1;
    if ((local_9 & 1) == 0) {
      in_stack_ffffffffffffffce = in_stack_ffffffffffffffcf;
    }
    local_9 = in_stack_ffffffffffffffce;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
    ::operator++(&local_20);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool PredicateSplitPassiveClauseContainer::setLimitsFromSimulation()
{
  bool tightened = false;
  for (const auto& queue : _queues)
  {
    bool currTightened = queue->setLimitsFromSimulation();
    tightened = tightened || currTightened;
  }
  return tightened;
}